

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O0

int ncnn::deconvolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined4 *puVar4;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000018;
  long *in_stack_00000020;
  int i_3;
  float *outptr_3;
  int k_1;
  float val_1;
  int q;
  float *kptr_1;
  float *outptr_2;
  int j_1;
  float bias_1;
  float *weight_data_ptr;
  Mat out_1;
  int p;
  int g_1;
  int outh_g;
  int h_g;
  int i_1;
  float *outptr_1;
  float w_1;
  int k;
  float val;
  float *outptr;
  int j;
  float bias;
  float *kptr;
  float *inptr;
  Mat out;
  int g;
  int bias_term;
  int outh;
  int outw;
  int h;
  int w;
  int i_2;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float local_504;
  undefined4 local_4dc;
  float local_4ac;
  undefined4 local_48c;
  int local_45c;
  int local_44c;
  int local_444;
  long local_440;
  int local_430;
  undefined4 *local_420;
  int *local_418;
  long local_410;
  undefined4 local_408;
  long *local_400;
  undefined4 local_3f8;
  int local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  long local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  undefined4 *local_3c0;
  float local_3b4;
  int local_3b0;
  float local_3ac;
  undefined4 *local_3a8;
  int local_3a0;
  undefined4 local_39c;
  long local_398;
  long local_380;
  undefined4 *local_378;
  int *local_370;
  long local_368;
  undefined4 local_360;
  long *local_358;
  undefined4 local_350;
  int local_34c;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 local_340;
  long local_338;
  int local_330;
  uint local_32c;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  long *local_310;
  long *local_308;
  long *local_300;
  long *local_2f8;
  undefined4 **local_2f0;
  undefined4 **local_2e0;
  int local_2b8;
  undefined4 local_2b4;
  undefined4 **local_2b0;
  int local_298;
  undefined4 local_294;
  undefined4 **local_290;
  undefined4 *local_288;
  undefined4 *local_278;
  undefined4 local_260;
  int local_25c;
  long *local_258;
  undefined4 **local_250;
  undefined4 local_248;
  int local_244;
  long *local_240;
  undefined4 **local_238;
  int local_22c;
  int local_21c;
  long *local_218;
  long *local_210;
  long *local_208;
  long local_200;
  long *local_1f8;
  long local_1f0;
  long *local_1e8;
  int local_1dc;
  undefined4 *local_1d8;
  int local_1d0;
  undefined4 local_1cc;
  undefined4 **local_1c8;
  undefined4 **local_1c0;
  int local_1b4;
  undefined4 *local_1b0;
  int local_1a8;
  undefined4 local_1a4;
  undefined4 **local_1a0;
  undefined4 **local_198;
  undefined4 **local_190;
  undefined4 **local_188;
  undefined4 **local_180;
  undefined4 **local_178;
  float local_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  long *local_148;
  float local_13c [3];
  long *local_130;
  undefined8 local_128;
  long *local_120;
  undefined8 local_118;
  long *local_110;
  undefined8 local_108;
  long *local_100;
  undefined8 local_f8;
  long *local_f0;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  long *local_c0;
  float local_b4 [3];
  long *local_a8;
  undefined8 local_a0;
  long *local_98;
  undefined8 local_90;
  long *local_88;
  undefined8 local_80;
  long *local_78;
  undefined8 local_70;
  long *local_68;
  long *local_60;
  undefined4 local_54;
  long local_50;
  undefined4 *local_48;
  undefined4 local_40;
  int local_3c;
  undefined4 **local_38;
  long *local_30;
  undefined4 local_24;
  long local_20;
  undefined4 *local_18;
  undefined4 local_10;
  int local_c;
  undefined4 **local_8;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  local_31c = *(int *)((long)in_RDI + 0x2c);
  local_320 = (int)in_RDI[6];
  local_324 = *(int *)((long)in_RSI + 0x2c);
  local_328 = (int)in_RSI[6];
  bVar5 = true;
  if (*in_RCX != 0) {
    bVar5 = in_RCX[8] * (long)(int)in_RCX[7] == 0;
  }
  local_32c = (uint)!bVar5;
  local_318 = in_R9D;
  local_314 = in_R8D;
  local_310 = in_RCX;
  local_308 = in_RDX;
  local_300 = in_RSI;
  local_2f8 = in_RDI;
  if ((local_320 == in_stack_00000010) && (in_stack_00000010 == local_328)) {
    for (local_330 = 0; local_330 < in_stack_00000010; local_330 = local_330 + 1) {
      local_238 = &local_378;
      local_240 = local_300;
      local_244 = local_330;
      local_248 = 1;
      local_1a8 = *(int *)((long)local_300 + 0x2c);
      local_3c0 = (undefined4 *)
                  (*local_300 +
                  (long)*(int *)((long)local_300 + 0x2c) * (long)local_330 * local_300[2]);
      local_50 = local_300[2];
      local_54 = (undefined4)local_300[3];
      local_60 = (long *)local_300[4];
      local_38 = &local_378;
      local_40 = 1;
      local_370 = (int *)0x0;
      local_350 = 2;
      local_348 = 1;
      local_344 = 1;
      local_340 = 1;
      local_338 = (long)local_1a8;
      local_218 = local_2f8;
      local_21c = local_330;
      local_380 = *local_2f8 +
                  (long)*(int *)((long)local_2f8 + 0x2c) * (long)local_330 * local_2f8[2];
      local_208 = local_308;
      local_398 = *local_308 + (long)(local_314 * local_330) * 4;
      if (local_32c == 0) {
        local_48c = 0;
      }
      else {
        local_1f0 = (long)local_330;
        local_1e8 = local_310;
        local_48c = *(undefined4 *)(*local_310 + local_1f0 * 4);
      }
      local_39c = local_48c;
      local_1a0 = &local_378;
      local_1a4 = local_48c;
      local_1b0 = local_3c0;
      for (local_1b4 = 0; local_1b4 < local_1a8; local_1b4 = local_1b4 + 1) {
        *local_1b0 = local_48c;
        local_1b0 = local_1b0 + 1;
      }
      for (local_3a0 = 0; local_3a0 < local_31c; local_3a0 = local_3a0 + 1) {
        local_178 = &local_378;
        local_3a8 = local_3c0 + local_3a0 * local_318;
        local_3ac = *(float *)(local_380 + (long)local_3a0 * 4);
        for (local_3b0 = 0; local_3b0 < local_314; local_3b0 = local_3b0 + 1) {
          local_3b4 = *(float *)(local_398 + (long)local_3b0 * 4);
          local_3a8[local_3b0 * in_stack_00000008] =
               local_3ac * local_3b4 + (float)local_3a8[local_3b0 * in_stack_00000008];
        }
      }
      local_180 = &local_378;
      local_198 = local_1a0;
      local_48 = local_3c0;
      local_3c = local_1a8;
      local_378 = local_3c0;
      local_368 = local_50;
      local_360 = local_54;
      local_358 = local_60;
      local_34c = local_1a8;
      for (local_3c4 = 0; local_3c4 < local_324; local_3c4 = local_3c4 + 1) {
        local_4ac = (float)local_3c0[local_3c4];
        local_c0 = in_stack_00000020;
        local_b4[0] = local_4ac;
        switch(in_stack_00000018) {
        case 1:
          dVar6 = std::fmax((double)(ulong)(uint)local_4ac,0.0);
          local_b4[0] = SUB84(dVar6,0);
          break;
        case 2:
          local_68 = in_stack_00000020;
          local_70 = 0;
          local_c4 = *(float *)*in_stack_00000020;
          if (local_4ac <= 0.0) {
            local_4ac = local_4ac * local_c4;
          }
          local_b4[0] = local_4ac;
          break;
        case 3:
          local_78 = in_stack_00000020;
          local_80 = 0;
          local_c8 = *(float *)*in_stack_00000020;
          local_88 = in_stack_00000020;
          local_90 = 1;
          local_cc = *(float *)(*in_stack_00000020 + 4);
          if (local_4ac < local_c8) {
            local_b4[0] = local_c8;
          }
          if (local_cc < local_b4[0]) {
            local_b4[0] = local_cc;
          }
          break;
        case 4:
          local_d0 = 88.37626;
          pfVar3 = std::min<float>(local_b4,&local_d0);
          local_b4[0] = *pfVar3;
          local_d4 = -88.37626;
          pfVar3 = std::max<float>(local_b4,&local_d4);
          local_b4[0] = *pfVar3;
          dVar6 = std::exp((double)(ulong)(uint)-local_b4[0]);
          local_b4[0] = 1.0 / (SUB84(dVar6,0) + 1.0);
          break;
        case 5:
          auVar7._0_8_ = std::exp((double)(ulong)(uint)local_4ac);
          auVar7._8_8_ = extraout_XMM0_Qb;
          auVar8._4_12_ = auVar7._4_12_;
          auVar8._0_4_ = SUB84(auVar7._0_8_,0) + 1.0;
          dVar6 = std::log(auVar8._0_8_);
          dVar6 = std::tanh(dVar6);
          local_b4[0] = local_4ac * SUB84(dVar6,0);
          break;
        case 6:
          local_98 = in_stack_00000020;
          local_a0 = 0;
          local_d8 = *(float *)*in_stack_00000020;
          local_a8 = in_stack_00000020;
          local_b4[1] = 1.4013e-45;
          local_b4[2] = 0.0;
          local_dc = *(float *)(*in_stack_00000020 + 4);
          local_e0 = -local_dc / local_d8;
          local_e4 = 1.0 / local_d8 + local_e0;
          if (local_e0 <= local_4ac) {
            if (local_4ac <= local_e4) {
              local_b4[0] = local_4ac * (local_4ac * local_d8 + local_dc);
            }
          }
          else {
            local_b4[0] = 0.0;
          }
        }
        local_3c0[local_3c4] = local_b4[0];
      }
      local_2f0 = &local_378;
      local_290 = local_2f0;
      if (local_370 != (int *)0x0) {
        local_294 = 0xffffffff;
        LOCK();
        local_298 = *local_370;
        *local_370 = *local_370 + -1;
        UNLOCK();
        if (local_298 == 1) {
          if (local_358 == (long *)0x0) {
            local_288 = local_378;
            if (local_378 != (undefined4 *)0x0) {
              free(local_378);
            }
          }
          else {
            (**(code **)(*local_358 + 0x18))(local_358,local_378);
          }
        }
      }
    }
  }
  else {
    local_3c8 = local_320 / in_stack_00000010;
    local_3cc = local_328 / in_stack_00000010;
    for (local_3d0 = 0; local_3d0 < in_stack_00000010; local_3d0 = local_3d0 + 1) {
      for (local_3d4 = 0; local_3d4 < local_3cc; local_3d4 = local_3d4 + 1) {
        local_25c = local_3d0 * local_3cc + local_3d4;
        local_250 = &local_420;
        local_258 = local_300;
        local_260 = 1;
        local_1d0 = *(int *)((long)local_300 + 0x2c);
        puVar4 = (undefined4 *)
                 (*local_300 +
                 (long)*(int *)((long)local_300 + 0x2c) * (long)local_25c * local_300[2]);
        local_20 = local_300[2];
        local_24 = (undefined4)local_300[3];
        local_30 = (long *)local_300[4];
        local_8 = &local_420;
        local_10 = 1;
        local_418 = (int *)0x0;
        local_3f8 = 2;
        local_3f0 = 1;
        local_3ec = 1;
        local_3e8 = 1;
        local_3e0 = (long)local_1d0;
        local_210 = local_308;
        lVar2 = *local_308;
        if (local_32c == 0) {
          local_4dc = 0;
        }
        else {
          local_200 = (long)(local_3d0 * local_3cc + local_3d4);
          local_1f8 = local_310;
          local_4dc = *(undefined4 *)(*local_310 + local_200 * 4);
        }
        local_1c8 = &local_420;
        local_1cc = local_4dc;
        local_1d8 = puVar4;
        for (local_1dc = 0; local_1dc < local_1d0; local_1dc = local_1dc + 1) {
          *local_1d8 = local_4dc;
          local_1d8 = local_1d8 + 1;
        }
        for (local_430 = 0; local_430 < local_31c; local_430 = local_430 + 1) {
          local_188 = &local_420;
          local_440 = lVar2 + (long)(local_314 * local_3c8 * local_3cc * local_3d0) * 4 +
                      (long)(local_314 * local_3c8 * local_3d4) * 4;
          for (local_444 = 0; local_444 < local_3c8; local_444 = local_444 + 1) {
            local_22c = local_3c8 * local_3d0 + local_444;
            fVar1 = *(float *)(*local_2f8 +
                               (long)*(int *)((long)local_2f8 + 0x2c) * (long)local_22c *
                               local_2f8[2] + (long)local_430 * 4);
            for (local_44c = 0; local_44c < local_314; local_44c = local_44c + 1) {
              puVar4[(long)(local_430 * local_318) + (long)(local_44c * in_stack_00000008)] =
                   fVar1 * *(float *)(local_440 + (long)local_44c * 4) +
                   (float)puVar4[(long)(local_430 * local_318) +
                                 (long)(local_44c * in_stack_00000008)];
            }
            local_440 = local_440 + (long)local_314 * 4;
          }
        }
        local_190 = &local_420;
        local_1c0 = local_1c8;
        local_18 = puVar4;
        local_c = local_1d0;
        local_420 = puVar4;
        local_410 = local_20;
        local_408 = local_24;
        local_400 = local_30;
        local_3f4 = local_1d0;
        for (local_45c = 0; local_45c < local_324; local_45c = local_45c + 1) {
          local_504 = (float)puVar4[local_45c];
          local_148 = in_stack_00000020;
          local_13c[0] = local_504;
          switch(in_stack_00000018) {
          case 1:
            dVar6 = std::fmax((double)(ulong)(uint)local_504,0.0);
            local_13c[0] = SUB84(dVar6,0);
            break;
          case 2:
            local_f0 = in_stack_00000020;
            local_f8 = 0;
            local_14c = *(float *)*in_stack_00000020;
            if (local_504 <= 0.0) {
              local_504 = local_504 * local_14c;
            }
            local_13c[0] = local_504;
            break;
          case 3:
            local_100 = in_stack_00000020;
            local_108 = 0;
            local_150 = *(float *)*in_stack_00000020;
            local_110 = in_stack_00000020;
            local_118 = 1;
            local_154 = *(float *)(*in_stack_00000020 + 4);
            if (local_504 < local_150) {
              local_13c[0] = local_150;
            }
            if (local_154 < local_13c[0]) {
              local_13c[0] = local_154;
            }
            break;
          case 4:
            local_158 = 88.37626;
            pfVar3 = std::min<float>(local_13c,&local_158);
            local_13c[0] = *pfVar3;
            local_15c = -88.37626;
            pfVar3 = std::max<float>(local_13c,&local_15c);
            local_13c[0] = *pfVar3;
            dVar6 = std::exp((double)(ulong)(uint)-local_13c[0]);
            local_13c[0] = 1.0 / (SUB84(dVar6,0) + 1.0);
            break;
          case 5:
            auVar9._0_8_ = std::exp((double)(ulong)(uint)local_504);
            auVar9._8_8_ = extraout_XMM0_Qb_00;
            auVar10._4_12_ = auVar9._4_12_;
            auVar10._0_4_ = SUB84(auVar9._0_8_,0) + 1.0;
            dVar6 = std::log(auVar10._0_8_);
            dVar6 = std::tanh(dVar6);
            local_13c[0] = local_504 * SUB84(dVar6,0);
            break;
          case 6:
            local_120 = in_stack_00000020;
            local_128 = 0;
            local_160 = *(float *)*in_stack_00000020;
            local_130 = in_stack_00000020;
            local_13c[1] = 1.4013e-45;
            local_13c[2] = 0.0;
            local_164 = *(float *)(*in_stack_00000020 + 4);
            local_168 = -local_164 / local_160;
            local_16c = 1.0 / local_160 + local_168;
            if (local_168 <= local_504) {
              if (local_504 <= local_16c) {
                local_13c[0] = local_504 * (local_504 * local_160 + local_164);
              }
            }
            else {
              local_13c[0] = 0.0;
            }
          }
          puVar4[local_45c] = local_13c[0];
        }
        local_2e0 = &local_420;
        local_2b0 = local_2e0;
        if (local_418 != (int *)0x0) {
          local_2b4 = 0xffffffff;
          LOCK();
          local_2b8 = *local_418;
          *local_418 = *local_418 + -1;
          UNLOCK();
          if (local_2b8 == 1) {
            if (local_400 == (long *)0x0) {
              local_278 = local_420;
              if (local_420 != (undefined4 *)0x0) {
                free(local_420);
              }
            }
            else {
              (**(code **)(*local_400 + 0x18))(local_400,local_420);
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int deconvolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat out = top_blob.row_range(g, 1);

            const float* inptr = bottom_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            const float bias = bias_term ? bias_data[g] : 0.f;

            out.fill(bias);

            for (int j = 0; j < w; j++)
            {
                float* outptr = (float*)out + j * stride_w;

                const float val = inptr[j];

                for (int k = 0; k < kernel_w; k++)
                {
                    float w = kptr[k];
                    outptr[k * dilation_w] += val * w;
                }
            }

            {
                float* outptr = out;

                for (int i = 0; i < outw; i++)
                {
                    outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                }
            }
        }
    }
    else
    {
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                Mat out = top_blob.row_range(g * outh_g + p, 1);

                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;
                const float bias = bias_term ? bias_data[g * outh_g + p] : 0.f;

                out.fill(bias);

                for (int j = 0; j < w; j++)
                {
                    float* outptr = (float*)out + j * stride_w;

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float val = bottom_blob.row(h_g * g + q)[j];

                        for (int k = 0; k < kernel_w; k++)
                        {
                            outptr[k * dilation_w] += val * kptr[k];
                        }

                        kptr += kernel_w;
                    }
                }

                {
                    float* outptr = out;

                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                    }
                }
            }
        }
    }

    return 0;
}